

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address-conversion.cc
# Opt level: O0

string * num2mac_abi_cxx11_(uint64_t i)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  reference pvVar4;
  ulong in_RSI;
  string *in_RDI;
  size_t i_1;
  stringstream ss;
  size_t j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> nums;
  value_type_conflict1 *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  size_type local_1d8;
  stringstream local_1d0 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c0 [15];
  undefined4 local_48;
  uint local_34;
  ulong local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  ulong local_10;
  
  local_10 = in_RSI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x14b831);
  for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
    local_34 = (uint)(byte)local_10;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               in_stack_fffffffffffffdb8);
    local_10 = local_10 - (local_10 & 0xff) >> 8;
  }
  local_48 = (undefined4)local_10;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
            );
  std::__cxx11::stringstream::stringstream(local_1d0);
  std::ostream::operator<<(local_1c0,std::hex);
  for (local_1d8 = 5; local_1d8 != 0; local_1d8 = local_1d8 - 1) {
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(local_1c0,_Var1._M_c);
    _Var2 = std::setw(2);
    poVar3 = std::operator<<(poVar3,_Var2);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_28,local_1d8);
    std::ostream::operator<<(poVar3,*pvVar4);
    std::operator<<((ostream *)local_1c0,":");
  }
  this = local_1c0;
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(this,_Var1._M_c);
  _Var2 = std::setw(2);
  poVar3 = std::operator<<(poVar3,_Var2);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_28,0);
  std::ostream::operator<<(poVar3,*pvVar4);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1d0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this);
  return in_RDI;
}

Assistant:

std::string num2mac(uint64_t i)
{
    std::vector<uint32_t> nums;
    for (size_t j = 0; j < 5; ++j)
    {
        nums.push_back(i % 0x100);
        i = (i - i % 0x100) / 0x100;
    }
    nums.push_back(i);

    std::stringstream ss;
    ss << std::hex;
    for (size_t i = 5; i > 0; --i)
    {
        ss << std::setfill('0') << std::setw(2) << nums[i];
        ss << ":";
    }
    ss << std::setfill('0') << std::setw(2) << nums[0];
    return ss.str();
}